

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O1

void kv_set_str_value_test(btree_kv_ops *kv_ops)

{
  char *__format;
  uint64_t v_src;
  uint64_t v_dst;
  timeval __test_begin;
  long local_78;
  long local_70;
  timeval local_68;
  btree local_58;
  
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  memleak_start();
  local_78 = 100;
  local_58.vsize = '\b';
  (*kv_ops->set_value)(&local_58,&local_78,&local_70);
  if (local_78 != local_70) {
    kv_set_str_value_test();
  }
  local_70 = 200;
  (*kv_ops->set_value)(&local_58,&local_70,&local_78);
  if (local_78 != local_70) {
    kv_set_str_value_test();
  }
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_set_str_value_test(btree_kv_ops*)::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv_set_str_value_test");
  return;
}

Assistant:

void kv_set_str_value_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    uint64_t v_dst, v_src = 100;
    btree *tree = alca(struct btree, 1);
    tree->vsize = sizeof(v_dst);

    // set dst value
    kv_ops->set_value(tree,(void *)&v_src,(void *)&v_dst);

    // verify
    TEST_CHK(v_src == v_dst);

    // update dest and copy back to source
    v_dst = 200;
    kv_ops->set_value(tree,(void *)&v_dst,(void *)&v_src);
    TEST_CHK(v_src == v_dst);

    memleak_end();
    TEST_RESULT("kv_set_str_value_test");
}